

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gme.cpp
# Opt level: O2

gme_type_t gme_identify_extension(char *extension_)

{
  gme_type_t pgVar1;
  int iVar2;
  char *pcVar3;
  int i;
  long lVar4;
  char *pcVar5;
  gme_type_t *ppgVar6;
  char extension [6];
  
  pcVar3 = strrchr(extension_,0x2e);
  pcVar5 = pcVar3 + 1;
  if (pcVar3 == (char *)0x0) {
    pcVar5 = extension_;
  }
  lVar4 = 0;
  do {
    if (lVar4 == 6) {
      extension[0] = '\0';
      break;
    }
    iVar2 = toupper((int)pcVar5[lVar4]);
    extension[lVar4] = (char)iVar2;
    lVar4 = lVar4 + 1;
  } while ((char)iVar2 != '\0');
  gme_type_list();
  ppgVar6 = gme_type_list::gme_type_list_;
  do {
    pgVar1 = *ppgVar6;
    if (pgVar1 == (gme_type_t)0x0) {
      return (gme_type_t)0x0;
    }
    iVar2 = strcmp(extension,pgVar1->extension_);
    ppgVar6 = ppgVar6 + 1;
  } while (iVar2 != 0);
  return pgVar1;
}

Assistant:

BLARGG_EXPORT gme_type_t gme_identify_extension( const char* extension_ )
{
	char const* end = strrchr( extension_, '.' );
	if ( end )
		extension_ = end + 1;
	
	char extension [6];
	to_uppercase( extension_, sizeof extension, extension );
	
	for ( gme_type_t const* types = gme_type_list(); *types; types++ )
		if ( !strcmp( extension, (*types)->extension_ ) )
			return *types;
	return 0;
}